

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

Err * vm_run_string(VM *vm,int pkg,char *code)

{
  Err *err;
  char *code_local;
  int pkg_local;
  VM *vm_local;
  
  vm_local = (VM *)parse(vm,pkg,(char *)0x0,code);
  if (vm_local == (VM *)0x0) {
    vm_local = (VM *)vm_run(vm,vm->pkgs[pkg].main_fn,0);
  }
  return (Err *)vm_local;
}

Assistant:

Err * vm_run_string(VM *vm, int pkg, char *code) {
	// TODO: save and restore VM state in case of error

	// Parse the source code
	Err *err = parse(vm, pkg, NULL, code);
	if (err != NULL) {
		return err;
	}

	// Run the code
	return vm_run(vm, vm->pkgs[pkg].main_fn, 0);
}